

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

pool_ptr<soul::AST::Graph> __thiscall
soul::StructuralParser::parseGraphDecl
          (StructuralParser *this,CodeLocation *keywordLocation,Namespace *ns)

{
  RefCountedPtr<soul::SourceCodeText> local_18;
  undefined8 local_10;
  
  local_18.object = (SourceCodeText *)(ns->super_ModuleBase).super_ASTObject._vptr_ASTObject;
  if (local_18.object != (SourceCodeText *)0x0) {
    ((local_18.object)->super_RefCountedObject).refCount =
         ((local_18.object)->super_RefCountedObject).refCount + 1;
  }
  local_10._0_4_ = (ns->super_ModuleBase).super_ASTObject.objectType;
  local_10._4_4_ = *(undefined4 *)&(ns->super_ModuleBase).super_ASTObject.field_0xc;
  parseTopLevelItem<soul::AST::Graph>(this,keywordLocation,(ModuleBase *)&stack0xffffffffffffffe8);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&stack0xffffffffffffffe8);
  return (pool_ptr<soul::AST::Graph>)(Graph *)this;
}

Assistant:

pool_ptr<AST::Graph>     parseGraphDecl     (CodeLocation keywordLocation, AST::Namespace&  ns)   { return parseTopLevelItem<AST::Graph>     (keywordLocation, ns); }